

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

ravitype_t get_type(LuaSymbol *symbol)

{
  ravitype_t local_14;
  ravitype_t t;
  LuaSymbol *symbol_local;
  
  local_14 = RAVI_TANY;
  if (symbol->symbol_type == SYM_LOCAL) {
    if (((symbol->field_1).variable.value_type.type_code == RAVI_TNUMINT) ||
       ((symbol->field_1).variable.value_type.type_code == RAVI_TNUMFLT)) {
      local_14 = (symbol->field_1).variable.value_type.type_code;
    }
  }
  else if ((symbol->symbol_type == SYM_UPVALUE) &&
          (((symbol->field_1).variable.value_type.type_code == RAVI_TNUMINT ||
           ((symbol->field_1).variable.value_type.type_code == RAVI_TNUMFLT)))) {
    local_14 = (symbol->field_1).variable.value_type.type_code;
  }
  return local_14;
}

Assistant:

static ravitype_t get_type(LuaSymbol *symbol) {
	ravitype_t t = RAVI_TANY;
	if (symbol->symbol_type == SYM_LOCAL) {
		if (symbol->variable.value_type.type_code == RAVI_TNUMINT ||
		    symbol->variable.value_type.type_code == RAVI_TNUMFLT)
			t = symbol->variable.value_type.type_code;
	}
	else if (symbol->symbol_type == SYM_UPVALUE) {
		if (symbol->upvalue.value_type.type_code == RAVI_TNUMINT ||
		    symbol->upvalue.value_type.type_code == RAVI_TNUMFLT)
			t = symbol->upvalue.value_type.type_code;
	}
	return t;
}